

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Count.cpp
# Opt level: O0

void __thiscall Count::Count(Count *this,shared_ptr<Launcher> *launcher)

{
  undefined8 *in_RDI;
  Launcher *in_stack_ffffffffffffff88;
  Application *in_stack_ffffffffffffff90;
  shared_ptr<QueryCompiler> *this_00;
  shared_ptr<QueryCompiler> local_20 [2];
  
  Application::Application(in_stack_ffffffffffffff90);
  *in_RDI = &PTR__Count_0037fbd0;
  in_RDI[10] = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0xb));
  std::shared_ptr<QueryCompiler>::shared_ptr((shared_ptr<QueryCompiler> *)0x27ff0a);
  std::shared_ptr<TreeDecomposition>::shared_ptr((shared_ptr<TreeDecomposition> *)0x27ff20);
  std::__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x27ff2a);
  Launcher::getCompiler(in_stack_ffffffffffffff88);
  this_00 = local_20;
  std::shared_ptr<QueryCompiler>::operator=
            (this_00,(shared_ptr<QueryCompiler> *)in_stack_ffffffffffffff88);
  std::shared_ptr<QueryCompiler>::~shared_ptr((shared_ptr<QueryCompiler> *)0x27ff5b);
  std::__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x27ff65);
  Launcher::getTreeDecomposition(in_stack_ffffffffffffff88);
  std::shared_ptr<TreeDecomposition>::operator=
            ((shared_ptr<TreeDecomposition> *)this_00,
             (shared_ptr<TreeDecomposition> *)in_stack_ffffffffffffff88);
  std::shared_ptr<TreeDecomposition>::~shared_ptr((shared_ptr<TreeDecomposition> *)0x27ff94);
  return;
}

Assistant:

Count::Count(shared_ptr<Launcher> launcher) 
{
    _compiler = launcher->getCompiler();
    _td = launcher->getTreeDecomposition();
}